

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

vector<duckdb::PartitionStatistics,_true> * __thiscall
duckdb::RowGroupCollection::GetPartitionStats
          (vector<duckdb::PartitionStatistics,_true> *__return_storage_ptr__,
          RowGroupCollection *this)

{
  pointer *ppPVar1;
  iterator __position;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  RowGroup *row_group;
  PartitionStatistics local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
  super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  for (this_01 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                           (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
      this_01 != (RowGroup *)0x0;
      this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01)) {
    RowGroup::GetPartitionStats(&local_38,this_01);
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
         super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>).
        super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>::
      _M_realloc_insert<duckdb::PartitionStatistics>
                (&__return_storage_ptr__->
                  super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
                 ,__position,&local_38);
    }
    else {
      (__position._M_current)->count_type = local_38.count_type;
      *(undefined4 *)&(__position._M_current)->field_0x14 = local_38._20_4_;
      (__position._M_current)->row_start = local_38.row_start;
      (__position._M_current)->count = local_38.count;
      ppPVar1 = &(__return_storage_ptr__->
                 super_vector<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
                 ).
                 super__Vector_base<duckdb::PartitionStatistics,_std::allocator<duckdb::PartitionStatistics>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PartitionStatistics> RowGroupCollection::GetPartitionStats() const {
	vector<PartitionStatistics> result;
	for (auto &row_group : row_groups->Segments()) {
		result.push_back(row_group.GetPartitionStats());
	}
	return result;
}